

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ddstexture.cpp
# Opt level: O1

void __thiscall FDDSTexture::ReadRGB(FDDSTexture *this,FWadLump *lump,BYTE *tcbuf)

{
  undefined1 *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  DWORD DVar7;
  DWORD DVar8;
  BYTE *pBVar9;
  uint uVar10;
  uint uVar11;
  uint *puVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  byte *pbVar20;
  
  DVar7 = this->AMask;
  uVar10 = 0x80000000 >> (this->AShiftL & 0x1f);
  if (DVar7 == 0) {
    uVar10 = 0;
  }
  puVar12 = (uint *)operator_new__((long)this->Pitch);
  uVar18 = (ulong)(this->super_FTexture).Height;
  if (uVar18 != 0) {
    do {
      uVar5 = (this->super_FTexture).Height;
      pBVar9 = this->Pixels;
      (*(lump->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[2])
                (lump,puVar12,(long)this->Pitch);
      uVar6 = (this->super_FTexture).Width;
      uVar11 = (uint)uVar6;
      if (uVar6 != 0) {
        puVar14 = puVar12;
        pbVar20 = tcbuf + (uint)uVar5 * (int)uVar18 * 4;
        if (tcbuf == (BYTE *)0x0) {
          pbVar20 = pBVar9 + uVar18;
        }
        do {
          DVar8 = this->Format;
          if (DVar8 == 2) {
            uVar15 = (uint)(ushort)*puVar14;
            puVar14 = (uint *)((long)puVar14 + 2);
          }
          else if (DVar8 == 3) {
            uVar15 = (uint)(uint3)*puVar14;
            puVar14 = (uint *)((long)puVar14 + 3);
          }
          else if (DVar8 == 4) {
            uVar15 = *puVar14;
            puVar14 = puVar14 + 1;
          }
          else {
            uVar15 = (uint)(byte)*puVar14;
            puVar14 = (uint *)((long)puVar14 + 1);
          }
          if (tcbuf == (BYTE *)0x0) {
            if ((DVar7 == 0) || ((uVar15 & uVar10) != 0)) {
              uVar16 = (this->RMask & uVar15) << (this->RShiftL & 0x1f);
              uVar17 = (this->GMask & uVar15) << (this->GShiftL & 0x1f);
              uVar15 = (uVar15 & this->BMask) << (this->BShiftL & 0x1f);
              *pbVar20 = RGB32k.All
                         [(ulong)((uVar15 >> (this->BShiftR & 0x1f) | uVar15) >> 0x1b) +
                          (ulong)((uVar17 >> (this->GShiftR & 0x1f) | uVar17) >> 0x16 & 0xffffffe0)
                          + (ulong)((uVar16 >> (this->RShiftR & 0x1f) | uVar16) >> 0x11 & 0x7c00)];
            }
            else {
              *pbVar20 = 0;
              puVar1 = &(this->super_FTexture).field_0x31;
              *puVar1 = *puVar1 | 8;
            }
            uVar13 = (ulong)(this->super_FTexture).Height;
          }
          else {
            uVar16 = (this->RMask & uVar15) << (this->RShiftL & 0x1f);
            uVar17 = (this->GMask & uVar15) << (this->GShiftL & 0x1f);
            bVar2 = this->GShiftR;
            uVar19 = (this->BMask & uVar15) << (this->BShiftL & 0x1f);
            bVar3 = this->BShiftR;
            uVar15 = (uVar15 & this->AMask) << (this->AShiftL & 0x1f);
            bVar4 = this->AShiftR;
            *pbVar20 = (byte)((uVar16 >> (this->RShiftR & 0x1f)) >> 0x18) | (byte)(uVar16 >> 0x18);
            pbVar20[1] = (byte)((uVar17 >> (bVar2 & 0x1f)) >> 0x18) | (byte)(uVar17 >> 0x18);
            pbVar20[2] = (byte)((uVar19 >> (bVar3 & 0x1f)) >> 0x18) | (byte)(uVar19 >> 0x18);
            pbVar20[3] = (byte)((uVar15 >> (bVar4 & 0x1f)) >> 0x18) | (byte)(uVar15 >> 0x18);
            uVar13 = 4;
          }
          uVar11 = uVar11 - 1;
          pbVar20 = pbVar20 + uVar13;
        } while (uVar11 != 0);
      }
      uVar18 = uVar18 - 1;
    } while ((int)uVar18 != 0);
  }
  operator_delete__(puVar12);
  return;
}

Assistant:

void FDDSTexture::ReadRGB (FWadLump &lump, BYTE *tcbuf)
{
	DWORD x, y;
	DWORD amask = AMask == 0 ? 0 : 0x80000000 >> AShiftL;
	BYTE *linebuff = new BYTE[Pitch];

	for (y = Height; y > 0; --y)
	{
		BYTE *buffp = linebuff;
		BYTE *pixelp = tcbuf? tcbuf + 4*y*Height : Pixels + y;
		lump.Read (linebuff, Pitch);
		for (x = Width; x > 0; --x)
		{
			DWORD c;
			if (Format == 4)
			{
				c = LittleLong(*(DWORD *)buffp); buffp += 4;
			}
			else if (Format == 2)
			{
				c = LittleShort(*(WORD *)buffp); buffp += 2;
			}
			else if (Format == 3)
			{
				c = buffp[0] | (buffp[1] << 8) | (buffp[2] << 16); buffp += 3;
			}
			else //  Format == 1
			{
				c = *buffp++;
			}
			if (!tcbuf)
			{
				if (amask == 0 || (c & amask))
				{
					DWORD r = (c & RMask) << RShiftL; r |= r >> RShiftR;
					DWORD g = (c & GMask) << GShiftL; g |= g >> GShiftR;
					DWORD b = (c & BMask) << BShiftL; b |= b >> BShiftR;
					*pixelp = RGB32k.RGB[r >> 27][g >> 27][b >> 27];
				}
				else
				{
					*pixelp = 0;
					bMasked = true;
				}
				pixelp += Height;
			}
			else
			{
				DWORD r = (c & RMask) << RShiftL; r |= r >> RShiftR;
				DWORD g = (c & GMask) << GShiftL; g |= g >> GShiftR;
				DWORD b = (c & BMask) << BShiftL; b |= b >> BShiftR;
				DWORD a = (c & AMask) << AShiftL; a |= a >> AShiftR;
				pixelp[0] = (BYTE)(r>>24);
				pixelp[1] = (BYTE)(g>>24);
				pixelp[2] = (BYTE)(b>>24);
				pixelp[3] = (BYTE)(a>>24);
				pixelp+=4;
			}
		}
	}
	delete[] linebuff;
}